

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O2

void despot::AEMS::FindMaxApproxErrorLeaf
               (VNode *vnode,double likelihood,double *bestAE,VNode **bestNode)

{
  bool bVar1;
  int iVar2;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *pvVar3;
  QNode *qnode;
  int a;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  bVar1 = VNode::IsLeaf(vnode);
  if (bVar1) {
    dVar8 = vnode->likelihood;
    iVar2 = VNode::depth(vnode);
    dVar5 = pow(DAT_0019fdd8,(double)iVar2);
    dVar6 = VNode::upper_bound(vnode);
    dVar7 = VNode::lower_bound(vnode);
    dVar8 = (dVar6 - dVar7) * dVar5 * likelihood * dVar8;
    if (*bestAE <= dVar8 && dVar8 != *bestAE) {
      *bestAE = dVar8;
      *bestNode = vnode;
    }
  }
  else {
    uVar4 = 0;
    while( true ) {
      pvVar3 = VNode::children(vnode);
      if ((ulong)((long)(pvVar3->
                        super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(pvVar3->
                        super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar4) break;
      qnode = VNode::Child(vnode,(ACT_TYPE)uVar4);
      FindMaxApproxErrorLeaf(qnode,likelihood,bestAE,bestNode);
      uVar4 = uVar4 + 1;
    }
  }
  return;
}

Assistant:

void AEMS::FindMaxApproxErrorLeaf(VNode* vnode, double likelihood,
	double& bestAE, VNode*& bestNode) {
	if (vnode->IsLeaf()) {
		double curAE = likelihood * vnode->likelihood * Globals::Discount(vnode->depth())
			* (vnode->upper_bound() - vnode->lower_bound());
		if (curAE > bestAE) {
			bestAE = curAE;
			bestNode = vnode;
		}
	} else {
		for (int a = 0; a < vnode->children().size(); a++) {
			FindMaxApproxErrorLeaf(vnode->Child(a), likelihood, bestAE,
				bestNode);
		}
	}
}